

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

void Abc_ExactStop(char *pFilename)

{
  char *pFilename_local;
  
  if (s_pSesStore == (Ses_Store_t *)0x0) {
    printf("BMS manager has not been started\n");
  }
  else {
    if (pFilename != (char *)0x0) {
      Ses_StoreWrite(s_pSesStore,pFilename,1,0,0,0);
    }
    if (s_pSesStore->pDebugEntries != (FILE *)0x0) {
      fclose((FILE *)s_pSesStore->pDebugEntries);
    }
    Ses_StoreClean(s_pSesStore);
  }
  return;
}

Assistant:

void Abc_ExactStop( const char * pFilename )
{
    if ( s_pSesStore )
    {
        if ( pFilename )
            Ses_StoreWrite( s_pSesStore, pFilename, 1, 0, 0, 0 );
        if ( s_pSesStore->pDebugEntries )
            fclose( s_pSesStore->pDebugEntries );
        Ses_StoreClean( s_pSesStore );
    }
    else
        printf( "BMS manager has not been started\n" );
}